

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_OrdinaryIsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  ushort uVar1;
  int iVar2;
  JSValueUnion JVar3;
  int iVar4;
  JSValueUnion JVar5;
  JSRuntime *rt;
  JSRefCountHeader *p;
  uint uVar7;
  JSRefCountHeader *p_2;
  uint uVar8;
  JSValue v;
  JSValue v_00;
  JSValue obj_00;
  JSValueUnion JVar6;
  
  JVar5 = obj.u;
  if ((int)obj.tag != -1) {
    return 0;
  }
  uVar1 = *(ushort *)((long)JVar5.ptr + 6);
  if (uVar1 == 0xd) {
LAB_0011cdd7:
    if ((int)val.tag != -1) {
      return 0;
    }
  }
  else {
    if (uVar1 != 0x29) {
      if (ctx->rt->class_array[uVar1].call == (JSClassCall *)0x0) {
        return 0;
      }
      if (uVar1 == 0xe) {
        iVar4 = JS_IsInstanceOf(ctx,val,**(JSValue **)((long)JVar5.ptr + 0x30));
        return iVar4;
      }
      goto LAB_0011cdd7;
    }
    if (*(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20) == '\0' || (int)val.tag != -1) {
      return 0;
    }
  }
  v_00 = JS_GetPropertyInternal(ctx,obj,0x3b,obj,0);
  JVar5 = v_00.u;
  uVar8 = (uint)v_00.tag;
  if (uVar8 == 6) {
    return -1;
  }
  JVar6 = val.u;
  if (uVar8 == 0xffffffff) {
    do {
      JVar3 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)JVar6.ptr + 0x18) + 0x38))->ptr;
      if ((int *)JVar3.ptr == (int *)0x0) {
        iVar4 = 0;
        if (*(short *)((long)JVar6.ptr + 6) != 0x29) goto LAB_0011ce53;
        *(int *)JVar6.ptr = *JVar6.ptr + 1;
        obj_00.tag = -1;
        obj_00.u.ptr = JVar6.ptr;
        goto LAB_0011ce92;
      }
      JVar6 = JVar3;
    } while (JVar3.ptr != JVar5.ptr);
    iVar4 = 1;
  }
  else {
    JS_ThrowTypeError(ctx,"operand \'prototype\' property is not an object");
LAB_0011ce41:
    iVar4 = -1;
  }
LAB_0011ce53:
  if ((0xfffffff4 < uVar8) && (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  return iVar4;
  while( true ) {
    if (uVar7 == 6) goto LAB_0011ce41;
    if (JVar5.ptr == JVar6.ptr) {
      iVar4 = 1;
      if ((uVar7 < 0xfffffff5) || (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, 1 < iVar2))
      goto LAB_0011ce53;
      rt = ctx->rt;
      JVar6 = JVar5;
      goto LAB_0011cf2b;
    }
    iVar4 = ctx->interrupt_counter;
    ctx->interrupt_counter = iVar4 + -1;
    if ((iVar4 < 2) && (iVar4 = __js_poll_interrupts(ctx), iVar4 != 0)) break;
LAB_0011ce92:
    obj_00 = JS_GetPrototypeFree(ctx,obj_00);
    v.tag = obj_00.tag;
    JVar6 = obj_00.u;
    uVar7 = (uint)obj_00.tag;
    iVar4 = 0;
    if (uVar7 == 2) goto LAB_0011ce53;
  }
  iVar4 = -1;
  if ((0xfffffff4 < uVar7) && (iVar2 = *JVar6.ptr, *(int *)JVar6.ptr = iVar2 + -1, iVar2 < 2)) {
    rt = ctx->rt;
LAB_0011cf2b:
    v.u.ptr = JVar6.ptr;
    __JS_FreeValueRT(rt,v);
  }
  goto LAB_0011ce53;
}

Assistant:

static int JS_OrdinaryIsInstanceOf(JSContext *ctx, JSValueConst val,
                                   JSValueConst obj)
{
    JSValue obj_proto;
    JSObject *proto;
    const JSObject *p, *proto1;
    BOOL ret;

    if (!JS_IsFunction(ctx, obj))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (p->class_id == JS_CLASS_BOUND_FUNCTION) {
        JSBoundFunction *s = p->u.bound_function;
        return JS_IsInstanceOf(ctx, val, s->func_obj);
    }

    /* Only explicitly boxed values are instances of constructors */
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    obj_proto = JS_GetProperty(ctx, obj, JS_ATOM_prototype);
    if (JS_VALUE_GET_TAG(obj_proto) != JS_TAG_OBJECT) {
        if (!JS_IsException(obj_proto))
            JS_ThrowTypeError(ctx, "operand 'prototype' property is not an object");
        ret = -1;
        goto done;
    }
    proto = JS_VALUE_GET_OBJ(obj_proto);
    p = JS_VALUE_GET_OBJ(val);
    for(;;) {
        proto1 = p->shape->proto;
        if (!proto1) {
            /* slow case if proxy in the prototype chain */
            if (unlikely(p->class_id == JS_CLASS_PROXY)) {
                JSValue obj1;
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, (JSObject *)p));
                for(;;) {
                    obj1 = JS_GetPrototypeFree(ctx, obj1);
                    if (JS_IsException(obj1)) {
                        ret = -1;
                        break;
                    }
                    if (JS_IsNull(obj1)) {
                        ret = FALSE;
                        break;
                    }
                    if (proto == JS_VALUE_GET_OBJ(obj1)) {
                        JS_FreeValue(ctx, obj1);
                        ret = TRUE;
                        break;
                    }
                    /* must check for timeout to avoid infinite loop */
                    if (js_poll_interrupts(ctx)) {
                        JS_FreeValue(ctx, obj1);
                        ret = -1;
                        break;
                    }
                }
            } else {
                ret = FALSE;
            }
            break;
        }
        p = proto1;
        if (proto == p) {
            ret = TRUE;
            break;
        }
    }
done:
    JS_FreeValue(ctx, obj_proto);
    return ret;
}